

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

void __thiscall LinearExpert::modelDisplay(LinearExpert *this,ostream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"Nu=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Nu)
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"invSigma=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                    &this->invSigma);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Mu=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Mu)
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Lambda=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                    &this->Lambda);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Psi=\n");
  poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Psi
                            );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void LINEAR_EXPERT_base::modelDisplay(std::ostream &out) const
{
    out << EXPAND_N(Nu) << std::endl;
    out << EXPAND_N(invSigma) << std::endl;
    out << EXPAND_N(Mu) << std::endl;
    out << EXPAND_N(Lambda) << std::endl;
    out << EXPAND_N(Psi) << std::endl;

//    out << EXPAND_N(H) << std::endl;
//    out << EXPAND_N(Sh) << std::endl;
//    out << EXPAND_N(Sz) << std::endl;
//    out << EXPAND_N(Sx) << std::endl;
//    out << EXPAND_N(Sxz) << std::endl;
//    out << EXPAND_N(Szz) << std::endl;
//    out << EXPAND_N(Sxx) << std::endl;
//    out << EXPAND_N(Nu0) << std::endl;
//
//    out << EXPAND(wPsi) << std::endl;
//    out << EXPAND(wNu) << std::endl;
//    out << EXPAND(wSigma) << std::endl;
//    out << EXPAND(wLambda) << std::endl;
//    out << EXPAND(alpha) << std::endl;
//    out << EXPAND(mixture->getPsi()) << std::endl;
//    out << EXPAND(mixture->getSigma()) << std::endl;
}